

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_string.hpp
# Opt level: O1

bool __thiscall
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::Keyword_(ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
           *this,Static_String *t_s)

{
  ulong uVar1;
  char *pcVar2;
  char *pcVar3;
  int iVar4;
  int iVar5;
  char cVar6;
  int iVar7;
  ulong uVar8;
  char *pcVar9;
  bool bVar10;
  
  uVar1 = t_s->m_size;
  pcVar2 = (this->m_position).m_pos;
  pcVar3 = (this->m_position).m_end;
  if ((ulong)((long)pcVar3 - (long)pcVar2) < uVar1) {
    return false;
  }
  iVar7 = (this->m_position).line;
  iVar5 = (this->m_position).col;
  iVar4 = (this->m_position).m_last_col;
  bVar10 = uVar1 == 0 || pcVar2 == pcVar3;
  pcVar9 = pcVar2;
  if (uVar1 == 0 || pcVar2 == pcVar3) {
LAB_00327c58:
    (this->m_position).line = iVar7;
    (this->m_position).col = iVar5;
    (this->m_position).m_pos = pcVar9;
    (this->m_position).m_last_col = iVar4;
  }
  else {
    cVar6 = *pcVar2;
    if (cVar6 == *t_s->data) {
      uVar8 = 1;
      do {
        bVar10 = cVar6 == '\n';
        if (bVar10) {
          iVar4 = iVar5;
        }
        iVar5 = iVar5 + 1;
        if (bVar10) {
          iVar5 = 1;
        }
        iVar7 = (uint)bVar10 + iVar7;
        pcVar9 = pcVar2 + uVar8;
        bVar10 = uVar1 <= uVar8 || pcVar9 == pcVar3;
        if (bVar10) goto LAB_00327c58;
        cVar6 = *pcVar9;
        pcVar9 = t_s->data + uVar8;
        uVar8 = uVar8 + 1;
      } while (cVar6 == *pcVar9);
    }
  }
  return bVar10;
}

Assistant:

constexpr size_t size() const noexcept { return m_size; }